

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

ExpressionValue * __thiscall
ExpressionValue::operator%
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  long lVar1;
  long lVar2;
  char *text;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  if ((this->type << 2 | other->type) == 5) {
    __return_storage_ptr__->type = Integer;
    lVar1 = (this->field_1).intValue;
    lVar2 = (other->field_1).intValue;
    if (lVar2 == -1 && lVar1 == -0x8000000000000000) {
      text = "Division overflow in expression";
    }
    else {
      if (lVar2 != 0) {
        (__return_storage_ptr__->field_1).intValue = lVar1 % lVar2;
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->field_1).intValue = lVar1;
      text = "Integer division by zero in expression";
    }
    Logger::queueError<>(Warning,text);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator%(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		if (intValue == INT64_MIN && other.intValue == -1){
			result.intValue = 0;
			Logger::queueError(Logger::Warning, "Division overflow in expression");
			return result;
		}
		if (other.intValue == 0)
		{
			result.intValue = intValue;
			Logger::queueError(Logger::Warning, "Integer division by zero in expression");
			return result;
		}
		result.intValue = intValue % other.intValue;
		break;
	default:
		break;
	}

	return result;
}